

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField
          (Reflection *this,Message *message1,Message *message2,OneofDescriptor *oneof_descriptor)

{
  uint32 key;
  uint32 key_00;
  CppType CVar1;
  LogMessage *pLVar2;
  double *pdVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  uint32 *puVar6;
  long *plVar7;
  float *pfVar8;
  bool *pbVar9;
  FieldDescriptor *this_00;
  int *value;
  Message *sub_message;
  string local_118;
  string local_f8;
  size_type *local_d8;
  string temp_string;
  int64 temp_int64;
  uint64 temp_uint64;
  double temp_double;
  uint32 local_68;
  uint local_64;
  int32 temp_int32;
  uint32 temp_uint32;
  float temp_float;
  int temp_int;
  bool local_49;
  Message *pMStack_48;
  bool temp_bool;
  LogFinisher local_39;
  FieldDescriptor *local_38;
  
  pMStack_48 = message2;
  if ((*(int *)(oneof_descriptor + 0x18) == 1) &&
     (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) == '\x01')) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&temp_double,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x1df);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&temp_double,
                        "CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&temp_double);
  }
  key = GetOneofCase(this,message1,oneof_descriptor);
  key_00 = GetOneofCase(this,pMStack_48,oneof_descriptor);
  local_d8 = &temp_string._M_string_length;
  temp_string._M_dataplus._M_p = (pointer)0x0;
  temp_string._M_string_length._0_1_ = 0;
  if (key == 0) {
    _temp_float = (LogMessage *)0x0;
    local_38 = (FieldDescriptor *)0x0;
  }
  else {
    local_38 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    CVar1 = FieldDescriptor::cpp_type(local_38);
    switch(CVar1) {
    case CPPTYPE_INT32:
      puVar6 = (uint32 *)GetRaw<int>(this,message1,local_38);
      local_68 = *puVar6;
      break;
    case CPPTYPE_INT64:
      plVar7 = GetRaw<long>(this,message1,local_38);
      temp_string.field_2._8_8_ = *plVar7;
      break;
    case CPPTYPE_UINT32:
      puVar4 = GetRaw<unsigned_int>(this,message1,local_38);
      local_64 = *puVar4;
      break;
    case CPPTYPE_UINT64:
      puVar5 = GetRaw<unsigned_long>(this,message1,local_38);
      temp_int64 = *puVar5;
      break;
    case CPPTYPE_DOUBLE:
      pdVar3 = GetRaw<double>(this,message1,local_38);
      temp_uint64 = (uint64)*pdVar3;
      break;
    case CPPTYPE_FLOAT:
      pfVar8 = GetRaw<float>(this,message1,local_38);
      temp_int32 = (int32)*pfVar8;
      break;
    case CPPTYPE_BOOL:
      pbVar9 = GetRaw<bool>(this,message1,local_38);
      local_49 = *pbVar9;
      break;
    case CPPTYPE_ENUM:
      puVar6 = (uint32 *)GetRaw<int>(this,message1,local_38);
      temp_uint32 = *puVar6;
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_((string *)&temp_double,this,message1,local_38);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&temp_double);
      std::__cxx11::string::~string((string *)&temp_double);
      break;
    case CPPTYPE_MESSAGE:
      _temp_float = (LogMessage *)ReleaseMessage(this,message1,local_38,(MessageFactory *)0x0);
      goto LAB_002ea182;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)&temp_double,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x20b);
      _temp_float = internal::LogMessage::operator<<
                              ((LogMessage *)&temp_double,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(local_38);
      pLVar2 = internal::LogMessage::operator<<(_temp_float,CVar1);
      internal::LogFinisher::operator=(&local_39,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)&temp_double);
    }
    _temp_float = (LogMessage *)0x0;
  }
LAB_002ea182:
  if (key_00 == 0) {
    ClearOneof(this,message1,oneof_descriptor);
  }
  else {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key_00);
    CVar1 = FieldDescriptor::cpp_type(this_00);
    switch(CVar1) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      value = GetRaw<int>(this,pMStack_48,this_00);
      SetField<int>(this,message1,this_00,value);
      break;
    case CPPTYPE_INT64:
      plVar7 = GetRaw<long>(this,pMStack_48,this_00);
      SetField<long>(this,message1,this_00,plVar7);
      break;
    case CPPTYPE_UINT32:
      puVar4 = GetRaw<unsigned_int>(this,pMStack_48,this_00);
      SetField<unsigned_int>(this,message1,this_00,puVar4);
      break;
    case CPPTYPE_UINT64:
      puVar5 = GetRaw<unsigned_long>(this,pMStack_48,this_00);
      SetField<unsigned_long>(this,message1,this_00,puVar5);
      break;
    case CPPTYPE_DOUBLE:
      pdVar3 = GetRaw<double>(this,pMStack_48,this_00);
      SetField<double>(this,message1,this_00,pdVar3);
      break;
    case CPPTYPE_FLOAT:
      pfVar8 = GetRaw<float>(this,pMStack_48,this_00);
      SetField<float>(this,message1,this_00,pfVar8);
      break;
    case CPPTYPE_BOOL:
      pbVar9 = GetRaw<bool>(this,pMStack_48,this_00);
      SetField<bool>(this,message1,this_00,pbVar9);
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_(&local_118,this,pMStack_48,this_00);
      SetString(this,message1,this_00,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      break;
    case CPPTYPE_MESSAGE:
      sub_message = ReleaseMessage(this,pMStack_48,this_00,(MessageFactory *)0x0);
      SetAllocatedMessage(this,message1,sub_message,this_00);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)&temp_double,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x22a);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)&temp_double,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(this_00);
      pLVar2 = internal::LogMessage::operator<<(pLVar2,CVar1);
      internal::LogFinisher::operator=(&local_39,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)&temp_double);
    }
  }
  if (key == 0) {
    ClearOneof(this,pMStack_48,oneof_descriptor);
    goto LAB_002ea531;
  }
  CVar1 = FieldDescriptor::cpp_type(local_38);
  switch(CVar1) {
  case CPPTYPE_INT32:
    puVar6 = &local_68;
    goto LAB_002ea43a;
  case CPPTYPE_INT64:
    SetField<long>(this,pMStack_48,local_38,(long *)(temp_string.field_2._M_local_buf + 8));
    break;
  case CPPTYPE_UINT32:
    SetField<unsigned_int>(this,pMStack_48,local_38,&local_64);
    break;
  case CPPTYPE_UINT64:
    SetField<unsigned_long>(this,pMStack_48,local_38,(unsigned_long *)&temp_int64);
    break;
  case CPPTYPE_DOUBLE:
    SetField<double>(this,pMStack_48,local_38,(double *)&temp_uint64);
    break;
  case CPPTYPE_FLOAT:
    SetField<float>(this,pMStack_48,local_38,(float *)&temp_int32);
    break;
  case CPPTYPE_BOOL:
    SetField<bool>(this,pMStack_48,local_38,&local_49);
    break;
  case CPPTYPE_ENUM:
    puVar6 = &temp_uint32;
LAB_002ea43a:
    SetField<int>(this,pMStack_48,local_38,(int *)puVar6);
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::string((string *)&local_f8,(string *)&local_d8);
    SetString(this,pMStack_48,local_38,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    break;
  case CPPTYPE_MESSAGE:
    SetAllocatedMessage(this,pMStack_48,(Message *)_temp_float,local_38);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&temp_double,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x24a);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)&temp_double,"Unimplemented type: ");
    CVar1 = FieldDescriptor::cpp_type(local_38);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,CVar1);
    internal::LogFinisher::operator=(&local_39,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&temp_double);
  }
LAB_002ea531:
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* message1, Message* message2,
                                const OneofDescriptor* oneof_descriptor) const {
  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = nullptr;
  std::string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = nullptr;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    // oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:           \
    temp_##TYPE = GetField<TYPE>(*message1, field1); \
    break;

      GET_TEMP_VALUE(INT32, int32);
      GET_TEMP_VALUE(INT64, int64);
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT, float);
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL, bool);
      GET_TEMP_VALUE(ENUM, int);
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 = descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
    SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
    break;

      SET_ONEOF_VALUE1(INT32, int32);
      SET_ONEOF_VALUE1(INT64, int64);
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT, float);
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL, bool);
      SET_ONEOF_VALUE1(ENUM, int);
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1, ReleaseMessage(message2, field2), field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)            \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    SetField<TYPE>(message2, field1, temp_##TYPE); \
    break;

      SET_ONEOF_VALUE2(INT32, int32);
      SET_ONEOF_VALUE2(INT64, int64);
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT, float);
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL, bool);
      SET_ONEOF_VALUE2(ENUM, int);
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}